

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void P_NightmareRespawn(AActor *mobj)

{
  double dVar1;
  double dVar2;
  ushort uVar3;
  double dVar4;
  bool bVar5;
  AActor *pAVar6;
  PClassActor *type;
  undefined4 uVar7;
  undefined4 uVar8;
  DVector3 local_38;
  
  pAVar6 = AActor::GetDefault(mobj);
  mobj->skillrespawncount = mobj->skillrespawncount + 1;
  if (((pAVar6->flags).Value & 0x100) == 0) {
    if (((pAVar6->flags2).Value & 0x40) == 0) {
      uVar7 = 0;
      uVar8 = 0xc1e00000;
    }
    else {
      uVar7 = 0xff800000;
      uVar8 = 0x41dfffff;
    }
  }
  else {
    uVar7 = 0xffc00000;
    uVar8 = 0x41dfffff;
  }
  dVar2 = (double)CONCAT44(uVar8,uVar7);
  type = (PClassActor *)DObject::GetClass((DObject *)mobj);
  local_38.X = (mobj->SpawnPoint).X;
  local_38.Y = (mobj->SpawnPoint).Y;
  local_38.Z = dVar2;
  pAVar6 = AActor::StaticSpawn(type,&local_38,NO_REPLACE,true);
  if ((dVar2 != -2147483648.0) || (NAN(dVar2))) {
    if ((dVar2 == 2147483647.0) && (!NAN(dVar2))) {
      (pAVar6->__Pos).Z = (pAVar6->__Pos).Z - (mobj->SpawnPoint).Z;
    }
  }
  else {
    dVar4 = (mobj->SpawnPoint).Z + (pAVar6->__Pos).Z;
    (pAVar6->__Pos).Z = dVar4;
    dVar1 = pAVar6->floorz;
    if (dVar4 < dVar1) {
      (pAVar6->__Pos).Z = dVar1;
      dVar4 = dVar1;
    }
    if (pAVar6->ceilingz < dVar4 + pAVar6->Height) {
      (pAVar6->__Pos).Z = pAVar6->ceilingz - pAVar6->Height;
    }
  }
  P_FindFloorCeiling(pAVar6,0xe);
  if ((dVar2 == -2147483648.0) && (!NAN(dVar2))) {
    dVar2 = (pAVar6->__Pos).Z;
    uVar7 = SUB84(dVar2,0);
    uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
    dVar1 = pAVar6->floorz;
    if (dVar2 < dVar1) {
      (pAVar6->__Pos).Z = dVar1;
      uVar7 = SUB84(dVar1,0);
      uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    if (pAVar6->ceilingz < (double)CONCAT44(uVar8,uVar7) + pAVar6->Height) {
      (pAVar6->__Pos).Z = pAVar6->ceilingz - pAVar6->Height;
    }
  }
  local_38.X = (pAVar6->__Pos).X;
  local_38.Y = (pAVar6->__Pos).Y;
  bVar5 = P_CheckPosition(pAVar6,(DVector2 *)&local_38,true);
  if (bVar5) {
    dVar2 = (pAVar6->__Pos).Z;
    (pAVar6->SpawnPoint).Z = (mobj->SpawnPoint).Z;
    dVar1 = (mobj->SpawnPoint).Y;
    (pAVar6->SpawnPoint).X = (mobj->SpawnPoint).X;
    (pAVar6->SpawnPoint).Y = dVar1;
    uVar3 = mobj->SpawnAngle;
    pAVar6->SpawnAngle = uVar3;
    pAVar6->SpawnFlags = mobj->SpawnFlags & 0xffffffef;
    (pAVar6->Angles).Yaw.Degrees = (double)uVar3;
    (*(pAVar6->super_DThinker).super_DObject._vptr_DObject[0xb])(pAVar6);
    pAVar6->reactiontime = 0x12;
    AActor::CopyFriendliness(pAVar6,mobj,false,true);
    pAVar6->Translation = mobj->Translation;
    pAVar6->skillrespawncount = mobj->skillrespawncount;
    (pAVar6->Prev).Z = dVar2;
    local_38.X = (mobj->__Pos).X;
    local_38.Y = (mobj->__Pos).Y;
    local_38.Z = (mobj->__Pos).Z;
    P_SpawnTeleportFog(mobj,&local_38,true,true);
    local_38.X = (mobj->SpawnPoint).X;
    local_38.Y = (mobj->SpawnPoint).Y;
    local_38.Z = dVar2;
    P_SpawnTeleportFog(mobj,&local_38,false,true);
    pAVar6 = mobj;
  }
  else {
    AActor::ClearCounters(pAVar6);
  }
  (*(pAVar6->super_DThinker).super_DObject._vptr_DObject[4])(pAVar6);
  return;
}

Assistant:

void P_NightmareRespawn (AActor *mobj)
{
	double z;
	AActor *mo;
	AActor *info = mobj->GetDefault();

	mobj->skillrespawncount++;

	// spawn the new monster (assume the spawn will be good)
	if (info->flags & MF_SPAWNCEILING)
		z = ONCEILINGZ;
	else if (info->flags2 & MF2_SPAWNFLOAT)
		z = FLOATRANDZ;
	else
		z = ONFLOORZ;

	// spawn it
	mo = AActor::StaticSpawn(mobj->GetClass(), DVector3(mobj->SpawnPoint.X, mobj->SpawnPoint.Y, z), NO_REPLACE, true);

	if (z == ONFLOORZ)
	{
		mo->AddZ(mobj->SpawnPoint.Z);
		if (mo->Z() < mo->floorz)
		{ // Do not respawn monsters in the floor, even if that's where they
		  // started. The initial P_ZMovement() call would have put them on
		  // the floor right away, but we need them on the floor now so we
		  // can use P_CheckPosition() properly.
			mo->SetZ(mo->floorz);
		}
		if (mo->Top() > mo->ceilingz)
		{
			mo->SetZ(mo->ceilingz- mo->Height);
		}
	}
	else if (z == ONCEILINGZ)
	{
		mo->AddZ(-mobj->SpawnPoint.Z);
	}

	// If there are 3D floors, we need to find floor/ceiling again.
	P_FindFloorCeiling(mo, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);

	if (z == ONFLOORZ)
	{
		if (mo->Z() < mo->floorz)
		{ // Do not respawn monsters in the floor, even if that's where they
		  // started. The initial P_ZMovement() call would have put them on
		  // the floor right away, but we need them on the floor now so we
		  // can use P_CheckPosition() properly.
			mo->SetZ(mo->floorz);
		}
		if (mo->Top() > mo->ceilingz)
		{ // Do the same for the ceiling.
			mo->SetZ(mo->ceilingz - mo->Height);
		}
	}

	// something is occupying its position?
	if (!P_CheckPosition(mo, mo->Pos(), true))
	{
		//[GrafZahl] MF_COUNTKILL still needs to be checked here.
		mo->ClearCounters();
		mo->Destroy ();
		return;		// no respawn
	}

	z = mo->Z();

	// inherit attributes from deceased one
	mo->SpawnPoint = mobj->SpawnPoint;
	mo->SpawnAngle = mobj->SpawnAngle;
	mo->SpawnFlags = mobj->SpawnFlags & ~MTF_DORMANT;	// It wasn't dormant when it died, so it's not dormant now, either.
	mo->Angles.Yaw = (double)mobj->SpawnAngle;

	mo->HandleSpawnFlags ();
	mo->reactiontime = 18;
	mo->CopyFriendliness (mobj, false);
	mo->Translation = mobj->Translation;

	mo->skillrespawncount = mobj->skillrespawncount;

	mo->Prev.Z = z;		// Do not interpolate Z position if we changed it since spawning.

	// spawn a teleport fog at old spot because of removal of the body?
	P_SpawnTeleportFog(mobj, mobj->Pos(), true, true);

	// spawn a teleport fog at the new spot
	P_SpawnTeleportFog(mobj, DVector3(mobj->SpawnPoint, z), false, true);

	// remove the old monster
	mobj->Destroy ();
}